

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O3

void P_LoadThings2(MapData *map)

{
  FMapThing *__s;
  short sVar1;
  ushort uVar2;
  FileReader *pFVar3;
  FMapThing *pFVar4;
  Node *pNVar5;
  WORD WVar6;
  int j;
  void *pvVar7;
  long lVar8;
  FDoomEdEntry *pFVar9;
  Node *pNVar10;
  long lVar11;
  uint uVar12;
  int *piVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  
  pFVar3 = map->MapLumps[1].Reader;
  if (pFVar3 == (FileReader *)0x0) {
    uVar14 = 0;
  }
  else {
    uVar14 = (ulong)(int)pFVar3->Length;
  }
  uVar12 = (uint)(uVar14 / 0x14);
  if (MapThingsConverted.Count <= uVar12 && uVar12 - MapThingsConverted.Count != 0) {
    TArray<FMapThing,_FMapThing>::Grow(&MapThingsConverted,uVar12 - MapThingsConverted.Count);
  }
  pFVar4 = MapThingsConverted.Array;
  MapThingsConverted.Count = uVar12;
  pvVar7 = operator_new__(uVar14);
  pFVar3 = map->MapLumps[1].Reader;
  lVar11 = pFVar3->Length;
  map->file = pFVar3;
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar3,0,0);
  (*(map->file->super_FileReaderBase)._vptr_FileReaderBase[2])(map->file,pvVar7,(long)(int)lVar11);
  if (0 < (int)uVar12) {
    piVar13 = pFVar4->args;
    lVar11 = (long)pvVar7 + 0xf;
    uVar14 = 0;
    do {
      __s = pFVar4 + uVar14;
      memset(__s,0,0x90);
      pFVar4[uVar14].thingid = (int)*(short *)((long)pvVar7 + uVar14 * 0x14);
      auVar15 = ZEXT416(*(uint *)((long)pvVar7 + uVar14 * 0x14 + 2));
      auVar15 = pshuflw(auVar15,auVar15,0x60);
      pFVar4[uVar14].pos.X = (double)(auVar15._0_4_ >> 0x10);
      pFVar4[uVar14].pos.Y = (double)(auVar15._4_4_ >> 0x10);
      pFVar4[uVar14].pos.Z = (double)(int)*(short *)((long)pvVar7 + uVar14 * 0x14 + 6);
      pFVar4[uVar14].angle = *(short *)((long)pvVar7 + uVar14 * 0x14 + 8);
      sVar1 = *(short *)((long)pvVar7 + uVar14 * 0x14 + 10);
      pFVar4[uVar14].EdNum = sVar1;
      pNVar5 = DoomEdMap.Nodes + (DoomEdMap.Size - 1 & (int)sVar1);
      do {
        pNVar10 = pNVar5;
        if ((pNVar10 == (Node *)0x0) || (pNVar10->Next == (Node *)0x1)) {
          pNVar10 = (Node *)0x0;
          break;
        }
        pNVar5 = pNVar10->Next;
      } while ((pNVar10->Pair).Key != (int)sVar1);
      pFVar9 = &(pNVar10->Pair).Value;
      if (pNVar10 == (Node *)0x0) {
        pFVar9 = (FDoomEdEntry *)0x0;
      }
      __s->info = pFVar9;
      uVar2 = *(ushort *)((long)pvVar7 + uVar14 * 0x14 + 0xc);
      __s->special = (uint)*(byte *)((long)pvVar7 + uVar14 * 0x14 + 0xe);
      lVar8 = 0;
      do {
        piVar13[lVar8] = (uint)*(byte *)(lVar11 + lVar8);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 5);
      sVar1 = (ushort)((uVar2 & 1) != 0) * 3;
      WVar6 = sVar1 + 0x18 + (uVar2 & 2) * 2;
      if ((uVar2 & 4) == 0) {
        WVar6 = sVar1 + (uVar2 & 2) * 2;
      }
      __s->SkillFilter = WVar6;
      __s->ClassFilter = uVar2 >> 5 & 7;
      __s->flags = uVar2 & 0xff18;
      if ((level.flags2._2_1_ & 0x80) != 0) {
        __s->flags = uVar2 & 0x718;
      }
      __s->RenderStyle = 0xe;
      __s->FloatbobPhase = -1;
      __s->Gravity = 1.0;
      __s->Alpha = -1.0;
      __s->health = 1;
      uVar14 = uVar14 + 1;
      piVar13 = piVar13 + 0x24;
      lVar11 = lVar11 + 0x14;
    } while (uVar14 != (uVar12 & 0x7fffffff));
  }
  operator_delete__(pvVar7);
  return;
}

Assistant:

void P_LoadThings2 (MapData * map)
{
	int	lumplen = map->Size(ML_THINGS);
	int numthings = lumplen / sizeof(mapthinghexen_t);

	char *mtp;

	MapThingsConverted.Resize(numthings);
	FMapThing *mti = &MapThingsConverted[0];

	mtp = new char[lumplen];
	map->Read(ML_THINGS, mtp);
	mapthinghexen_t *mth = (mapthinghexen_t*)mtp;

	for(int i = 0; i< numthings; i++)
	{
		memset (&mti[i], 0, sizeof(mti[i]));

		mti[i].thingid = LittleShort(mth[i].thingid);
		mti[i].pos.X = LittleShort(mth[i].x);
		mti[i].pos.Y = LittleShort(mth[i].y);
		mti[i].pos.Z = LittleShort(mth[i].z);
		mti[i].angle = LittleShort(mth[i].angle);
		mti[i].EdNum = LittleShort(mth[i].type);
		mti[i].info = DoomEdMap.CheckKey(mti[i].EdNum);
		mti[i].flags = LittleShort(mth[i].flags);
		mti[i].special = mth[i].special;
		for(int j=0;j<5;j++) mti[i].args[j] = mth[i].args[j];
		mti[i].SkillFilter = MakeSkill(mti[i].flags);
		mti[i].ClassFilter = (mti[i].flags & MTF_CLASS_MASK) >> MTF_CLASS_SHIFT;
		mti[i].flags &= ~(MTF_SKILLMASK|MTF_CLASS_MASK);
		if (level.flags2 & LEVEL2_HEXENHACK)
		{
			mti[i].flags &= 0x7ff;	// mask out Strife flags if playing an original Hexen map.
		}

		mti[i].Gravity = 1;
		mti[i].RenderStyle = STYLE_Count;
		mti[i].Alpha = -1;
		mti[i].health = 1;
		mti[i].FloatbobPhase = -1;
	}
	delete[] mtp;
}